

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O0

uint32_t ixgbe_get_link_speed(ixy_device *ixy)

{
  uint32_t uVar1;
  uint uVar2;
  long in_RDI;
  uint32_t links;
  ixy_device *__mptr;
  ixgbe_device *dev;
  undefined4 local_4;
  
  uVar1 = get_reg32(*(uint8_t **)(in_RDI + 0x70),0x42a4);
  if ((uVar1 & 0x40000000) == 0) {
    local_4 = 0;
  }
  else {
    uVar2 = uVar1 & 0x30000000;
    if (uVar2 == 0x10000000) {
      local_4 = 100;
    }
    else if (uVar2 == 0x20000000) {
      local_4 = 1000;
    }
    else if (uVar2 == 0x30000000) {
      local_4 = 10000;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

uint32_t ixgbe_get_link_speed(const struct ixy_device* ixy) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);
	uint32_t links = get_reg32(dev->addr, IXGBE_LINKS);
	if (!(links & IXGBE_LINKS_UP)) {
		return 0;
	}
	switch (links & IXGBE_LINKS_SPEED_82599) {
		case IXGBE_LINKS_SPEED_100_82599:
			return 100;
		case IXGBE_LINKS_SPEED_1G_82599:
			return 1000;
		case IXGBE_LINKS_SPEED_10G_82599:
			return 10000;
		default:
			return 0;
	}
}